

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::MultiBranchInstr::ClearTarget(MultiBranchInstr *this)

{
  Kind KVar1;
  long *plVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  void **value;
  anon_class_8_1_3fcf6586_for_fn local_40;
  anon_class_8_1_3fcf6586_for_fn local_38;
  
  bVar4 = BranchInstr::IsMultiBranch(&this->super_BranchInstr);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x700,"(IsMultiBranch())","IsMultiBranch()");
    if (!bVar4) goto LAB_00482525;
    *puVar5 = 0;
  }
  plVar2 = (long *)this->m_branchTargets;
  if (plVar2 != (long *)0x0) {
    KVar1 = this->m_kind;
    local_38.fn.this = (anon_class_8_1_8991fb9c_for_fn)(anon_class_8_1_8991fb9c_for_fn)this;
    if ((KVar1 == IntJumpTable) || (KVar1 == SingleCharStrJumpTable)) {
      lVar6 = this->m_baseCaseValue;
      lVar9 = lVar6 * 8 + *plVar2;
      for (; lVar6 <= this->m_lastCaseValue; lVar6 = lVar6 + 1) {
        anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
        anon_class_8_1_3fcf6586_for_fn::anon_class_8_1_3fcf6586_for_fn::operator()
                  (&local_38,(void **)(lVar9 + this->m_baseCaseValue * -8));
        lVar9 = lVar9 + 8;
      }
      value = (void **)(plVar2 + 1);
    }
    else if (KVar1 == StrDictionary) {
      local_40.fn.this = (anon_class_8_1_8991fb9c_for_fn)(anon_class_8_1_8991fb9c_for_fn)this;
      for (uVar7 = 0; uVar7 < *(uint *)((long)plVar2 + 0x1c); uVar7 = uVar7 + 1) {
        iVar8 = *(int *)(*plVar2 + uVar7 * 4);
        if (iVar8 != -1) {
          while (iVar8 != -1) {
            lVar6 = (long)iVar8;
            iVar8 = *(int *)(plVar2[1] + 8 + lVar6 * 0x18);
            anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
            anon_class_8_1_3fcf6586_for_fn::anon_class_8_1_3fcf6586_for_fn::operator()
                      (&local_40,(void **)(plVar2[1] + lVar6 * 0x18));
          }
        }
      }
      value = (void **)(plVar2 + 7);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                         ,0x435,"(false)","false");
      if (!bVar4) {
LAB_00482525:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
      value = (void **)0x0;
    }
    anon_func::anon_class_8_1_3fcf6586::anon_class_8_1_3fcf6586_for_fn::
    anon_class_8_1_3fcf6586_for_fn::anon_class_8_1_3fcf6586_for_fn::operator()(&local_38,value);
  }
  this->m_branchTargets = (void *)0x0;
  return;
}

Assistant:

void
MultiBranchInstr::ClearTarget()
{
    Assert(IsMultiBranch());

    MapMultiBrLabels([&](LabelInstr *const targetLabel)
    {
        ChangeLabelRef(targetLabel, nullptr);
    });
    m_branchTargets = nullptr;
}